

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O3

long ov_serialnumber(OggVorbis_File *vf,int i)

{
  uint uVar1;
  long *plVar2;
  
  do {
    do {
      uVar1 = i;
      i = vf->links - 1;
    } while (vf->links <= (int)uVar1);
  } while ((-1 < (int)uVar1) && (i = 0xffffffff, vf->seekable == 0));
  if ((int)uVar1 < 0) {
    plVar2 = &vf->current_serialno;
  }
  else {
    plVar2 = vf->serialnos + uVar1;
  }
  return *plVar2;
}

Assistant:

long ov_serialnumber(OggVorbis_File *vf,int i){
  if(i>=vf->links)return(ov_serialnumber(vf,vf->links-1));
  if(!vf->seekable && i>=0)return(ov_serialnumber(vf,-1));
  if(i<0){
    return(vf->current_serialno);
  }else{
    return(vf->serialnos[i]);
  }
}